

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O0

WallTime benchmark::walltime::Now(void)

{
  int iVar1;
  WallTime local_10;
  
  if (Now()::useCPUClock == '\0') {
    iVar1 = __cxa_guard_acquire(&Now()::useCPUClock);
    if (iVar1 != 0) {
      Now::useCPUClock = anon_unknown_1::UseCpuCycleClock();
      __cxa_guard_release(&Now()::useCPUClock);
    }
  }
  if ((Now::useCPUClock & 1U) == 0) {
    local_10 = anon_unknown_1::ChronoWalltimeNow();
  }
  else {
    local_10 = anon_unknown_1::CPUWalltimeNow();
  }
  return local_10;
}

Assistant:

WallTime Now()
{
  static bool useCPUClock = UseCpuCycleClock();
  if (useCPUClock) {
    return CPUWalltimeNow();
  } else {
    return ChronoWalltimeNow();
  }
}